

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::Data::SlowWrite(Data *this,void *data,uint byteSize)

{
  DataChunk *pDVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 *puVar8;
  ulong count;
  void *local_40;
  
  uVar5 = DataChunk::RemainingBytes(this->current);
  if (byteSize <= uVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xd83,"(byteSize > current->RemainingBytes())",
                                "We should not need an extension if there is enough space in the current chunk"
                               );
    if (!bVar4) {
LAB_008a5b2d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pDVar1 = this->current->nextChunk;
  if (pDVar1 != (DataChunk *)0x0) {
    pDVar1->currentByte = pDVar1->buffer;
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_40 = data;
  do {
    uVar6 = DataChunk::RemainingBytes(this->current);
    pDVar1 = this->current;
    uVar7 = DataChunk::RemainingBytes(pDVar1);
    uVar5 = byteSize - uVar6;
    if (byteSize < uVar6 || uVar5 == 0) {
      if (uVar7 < byteSize) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                    ,0x3a,"(RemainingBytes() >= byteSize)",
                                    "We do not have enough room");
        if (!bVar4) goto LAB_008a5b2d;
        *puVar8 = 0;
      }
      pbVar2 = pDVar1->currentByte;
      uVar5 = DataChunk::RemainingBytes(pDVar1);
      js_memcpy_s(pbVar2,(ulong)uVar5,local_40,(ulong)byteSize);
      pDVar1->currentByte = pDVar1->currentByte + byteSize;
      uVar5 = byteSize;
    }
    else {
      if (uVar7 < uVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeWriter.h"
                                    ,0x3a,"(RemainingBytes() >= byteSize)",
                                    "We do not have enough room");
        if (!bVar4) goto LAB_008a5b2d;
        *puVar8 = 0;
      }
      pbVar2 = pDVar1->currentByte;
      uVar7 = DataChunk::RemainingBytes(pDVar1);
      count = (ulong)uVar6;
      js_memcpy_s(pbVar2,(ulong)uVar7,local_40,count);
      pDVar1->currentByte = pDVar1->currentByte + count;
      if (this->current->nextChunk == (DataChunk *)0x0) {
        AddChunk(this,uVar5);
      }
      local_40 = (void *)((long)local_40 + count);
      this->current = this->current->nextChunk;
    }
    bVar4 = byteSize <= uVar6;
    byteSize = uVar5;
    if (bVar4) {
      return;
    }
  } while( true );
}

Assistant:

_NOINLINE void ByteCodeWriter::Data::SlowWrite(__in_bcount(byteSize) const void* data, __in uint byteSize)
    {
        AssertMsg(byteSize > current->RemainingBytes(), "We should not need an extension if there is enough space in the current chunk");
        uint bytesLeftToWrite = byteSize;
        byte* dataToBeWritten = (byte*)data;
        // the next chunk may already be created in the case that we are patching bytecode.
        // If so, we want to move the pointer to the beginning of the buffer
        if (current->nextChunk)
        {
            current->nextChunk->SetCurrentOffset(0);
        }
        while (true)
        {
            uint bytesFree = current->RemainingBytes();
            if (bytesFree >= bytesLeftToWrite)
            {
                current->WriteUnsafe(dataToBeWritten, bytesLeftToWrite);
                break;
            }

            current->WriteUnsafe(dataToBeWritten, bytesFree);
            bytesLeftToWrite -= bytesFree;
            dataToBeWritten += bytesFree;

            // Create a new chunk when needed
            if (!current->nextChunk)
            {
                AddChunk(bytesLeftToWrite);
            }
            current = current->nextChunk;
        }
    }